

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink-inl.h
# Opt level: O0

bool __thiscall spdlog::sinks::sink::should_log(sink *this,level_enum msg_level)

{
  level_enum msg_level_local;
  sink *this_local;
  memory_order __b;
  
  CLI::std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->level_).super___atomic_base<int>._M_i <= (int)msg_level;
}

Assistant:

SPDLOG_INLINE bool spdlog::sinks::sink::should_log(spdlog::level::level_enum msg_level) const
{
    return msg_level >= level_.load(std::memory_order_relaxed);
}